

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbbackingstore.cpp
# Opt level: O0

bool __thiscall
QXcbBackingStoreImage::scroll(QXcbBackingStoreImage *this,QRegion *area,int dx,int dy)

{
  QRect QVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  xcb_connection_t *pxVar9;
  QRect *in_RSI;
  QXcbBackingStoreImage *in_RDI;
  long in_FS_OFFSET;
  QRect *src;
  const_iterator __end2;
  const_iterator __begin2;
  QRegion *__range2;
  QRect dst;
  QRegion partialFlushRegion;
  QRect rect;
  QRegion destinationRegion;
  QPoint delta;
  QRegion scrollArea;
  QRect bounds;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  xcb_drawable_t in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  QPoint *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  xcb_pixmap_t in_stack_ffffffffffffff00;
  xcb_pixmap_t in_stack_ffffffffffffff04;
  xcb_gcontext_t in_stack_ffffffffffffff08;
  short in_stack_ffffffffffffff0c;
  short in_stack_ffffffffffffff0e;
  undefined4 in_stack_ffffffffffffff24;
  undefined1 fullRegion;
  QRegion *in_stack_ffffffffffffff28;
  QXcbBackingStoreImage *in_stack_ffffffffffffff30;
  long local_c8;
  bool local_91;
  undefined1 in_stack_ffffffffffffff70 [16];
  undefined1 in_stack_ffffffffffffff80 [16];
  undefined1 auVar10 [12];
  QRegion local_68;
  QRect local_60;
  QRegion local_50;
  undefined1 local_48 [8];
  undefined8 local_40;
  QRegion local_38;
  QSize local_30;
  undefined8 local_20;
  undefined8 local_18;
  long local_10;
  
  auVar10 = in_stack_ffffffffffffff80._4_12_;
  fullRegion = (undefined1)((uint)in_stack_ffffffffffffff24 >> 0x18);
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  local_30 = size((QXcbBackingStoreImage *)
                  CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  QRect::QRect((QRect *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8,
               (QSize *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  local_38.d = (QRegionData *)0xaaaaaaaaaaaaaaaa;
  QRegion::operator&(&local_38,in_RSI);
  local_40._0_4_ = -0x55555556;
  local_40._4_4_ = -0x55555556;
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
  local_48 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
  QRegion::translated((QRegion *)in_stack_fffffffffffffee8,
                      (QPoint *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  QRegion::intersected((QRect *)local_48);
  QRegion::~QRegion(&local_50);
  if ((in_RDI->m_clientSideScroll & 1U) == 0) {
    ensureGC((QXcbBackingStoreImage *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffedc);
    bVar2 = hasShm(in_RDI);
    if (bVar2) {
      local_68.d = (QRegionData *)0xaaaaaaaaaaaaaaaa;
      QRegion::intersected((QRegion *)&local_68);
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      shmPutImage(auVar10._4_8_,auVar10._0_4_,in_stack_ffffffffffffff70._8_8_,
                  in_stack_ffffffffffffff70._0_8_);
      QRegion::operator-=(&in_RDI->m_pendingFlush,(QRegion *)&local_68);
      QRegion::~QRegion(&local_68);
    }
    else {
      flushPixmap(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(bool)fullRegion);
    }
    local_c8 = QRegion::begin();
    lVar8 = QRegion::end();
    for (; local_c8 != lVar8; local_c8 = local_c8 + 0x10) {
      QRect::translated((QRect *)CONCAT26(in_stack_ffffffffffffff0e,
                                          CONCAT24(in_stack_ffffffffffffff0c,
                                                   in_stack_ffffffffffffff08)),
                        (QPoint *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      QRect::intersected((QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      pxVar9 = QXcbObject::xcb_connection((QXcbObject *)0x13f79b);
      in_stack_ffffffffffffff00 = in_RDI->m_xcb_pixmap;
      in_stack_ffffffffffffff04 = in_RDI->m_xcb_pixmap;
      in_stack_ffffffffffffff08 = in_RDI->m_gc;
      iVar3 = QRect::x((QRect *)0x13f7c7);
      in_stack_ffffffffffffff0c = (short)iVar3;
      iVar3 = QRect::y((QRect *)0x13f7d6);
      in_stack_ffffffffffffff0e = (short)iVar3;
      iVar3 = QRect::x((QRect *)0x13f7e8);
      iVar4 = QRect::y((QRect *)0x13f7f8);
      uVar5 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      uVar6 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      in_stack_fffffffffffffec8 = (int)(short)iVar3;
      in_stack_fffffffffffffed0 = (int)(short)iVar4;
      xcb_copy_area(pxVar9,in_stack_ffffffffffffff00,in_stack_ffffffffffffff04,
                    in_stack_ffffffffffffff08,(int)in_stack_ffffffffffffff0c,
                    (int)in_stack_ffffffffffffff0e,in_stack_fffffffffffffec8,
                    in_stack_fffffffffffffed0,uVar5 & 0xffff,uVar6 & 0xffff);
    }
    bVar2 = hasShm(in_RDI);
    QVar1.x2.m_i = local_60.x2.m_i;
    QVar1.y2.m_i = local_60.y2.m_i;
    QVar1.x1.m_i = local_60.x1.m_i;
    QVar1.y1.m_i = local_60.y1.m_i;
    if (bVar2) {
      QRegion::operator-=(&in_RDI->m_pendingFlush,(QRegion *)local_48);
      QVar1.x2.m_i = local_60.x2.m_i;
      QVar1.y2.m_i = local_60.y2.m_i;
      QVar1.x1.m_i = local_60.x1.m_i;
      QVar1.y1.m_i = local_60.y1.m_i;
    }
  }
  else {
    uVar7 = QImage::isNull();
    if ((uVar7 & 1) != 0) {
      local_91 = false;
      goto LAB_0013f8d9;
    }
    bVar2 = hasShm(in_RDI);
    if (bVar2) {
      preparePaint((QXcbBackingStoreImage *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (QRegion *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    }
    local_60.x1.m_i = -0x55555556;
    local_60.y1.m_i = -0x55555556;
    local_60.x2.m_i = -0x55555556;
    local_60.y2.m_i = -0x55555556;
    local_60 = (QRect)QRegion::boundingRect();
    qt_scrollRectInImage((QImage *)&in_RDI->m_qimage,&local_60,(QPoint *)&local_40);
    QVar1 = local_60;
  }
  local_60 = QVar1;
  QRegion::operator|=(&in_RDI->m_scrolledRegion,(QRegion *)local_48);
  local_91 = true;
LAB_0013f8d9:
  QRegion::~QRegion((QRegion *)local_48);
  QRegion::~QRegion(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return local_91;
}

Assistant:

bool QXcbBackingStoreImage::scroll(const QRegion &area, int dx, int dy)
{
    const QRect bounds(QPoint(), size());
    const QRegion scrollArea(area & bounds);
    const QPoint delta(dx, dy);
    const QRegion destinationRegion = scrollArea.translated(delta).intersected(bounds);

    if (m_clientSideScroll) {
        if (m_qimage.isNull())
            return false;

        if (hasShm())
            preparePaint(destinationRegion);

        const QRect rect = scrollArea.boundingRect();
        qt_scrollRectInImage(m_qimage, rect, delta);
    } else {
        ensureGC(m_xcb_pixmap);

        if (hasShm()) {
            QRegion partialFlushRegion = m_pendingFlush.intersected(scrollArea);
            shmPutImage(m_xcb_pixmap, partialFlushRegion);
            m_pendingFlush -= partialFlushRegion;
        } else {
            flushPixmap(scrollArea);
        }

        for (const QRect &src : scrollArea) {
            const QRect dst = src.translated(delta).intersected(bounds);
            xcb_copy_area(xcb_connection(),
                          m_xcb_pixmap,
                          m_xcb_pixmap,
                          m_gc,
                          src.x(), src.y(),
                          dst.x(), dst.y(),
                          dst.width(), dst.height());
        }

        if (hasShm())
            m_pendingFlush -= destinationRegion;
    }

    m_scrolledRegion |= destinationRegion;

    return true;
}